

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O1

S1Interval __thiscall S1Interval::Intersection(S1Interval *this,S1Interval *y)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  ulong uVar4;
  double dVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  S1Interval SVar10;
  S2LogMessage local_28;
  
  dVar1 = (y->bounds_).c_[0];
  dVar5 = (y->bounds_).c_[1];
  if ((((dVar1 == 3.141592653589793) && (!NAN(dVar1))) && (dVar5 == -3.141592653589793)) &&
     (!NAN(dVar5))) {
    dVar9 = 3.141592653589793;
    dVar5 = -3.141592653589793;
    goto LAB_0019f25f;
  }
  dVar9 = (this->bounds_).c_[0];
  dVar2 = (this->bounds_).c_[1];
  if (dVar2 < dVar9) {
    if ((dVar9 <= dVar1) || (dVar1 <= dVar2)) {
      bVar3 = dVar2 != -3.141592653589793 || dVar9 != 3.141592653589793;
      goto LAB_0019ef76;
    }
  }
  else if (dVar9 <= dVar1) {
    bVar3 = dVar1 <= dVar2;
LAB_0019ef76:
    if (bVar3) {
      if (dVar9 <= dVar2) {
        if (dVar9 <= dVar5) {
          bVar3 = dVar5 <= dVar2;
          goto LAB_0019f15c;
        }
      }
      else if ((dVar9 <= dVar5) || (dVar5 <= dVar2)) {
        bVar3 = dVar9 != 3.141592653589793 || dVar2 != -3.141592653589793;
LAB_0019f15c:
        if (bVar3) {
          dVar8 = dVar5 - dVar1;
          if (dVar8 < 0.0) {
            uVar4 = -(ulong)(0.0 < dVar8 + 6.283185307179586);
            dVar8 = (double)((ulong)(dVar8 + 6.283185307179586) & uVar4 |
                            ~uVar4 & 0xbff0000000000000);
          }
          dVar7 = dVar2 - dVar9;
          if (dVar7 < 0.0) {
            uVar4 = -(ulong)(0.0 < dVar7 + 6.283185307179586);
            dVar7 = (double)((ulong)(dVar7 + 6.283185307179586) & uVar4 |
                            ~uVar4 & 0xbff0000000000000);
          }
          dVar9 = (double)(~-(ulong)(dVar8 < dVar7) & (ulong)dVar9 |
                          (ulong)dVar1 & -(ulong)(dVar8 < dVar7));
          if (dVar7 <= dVar8) {
            dVar5 = dVar2;
          }
          goto LAB_0019f25f;
        }
      }
      bVar3 = false;
      if ((ABS(dVar1) <= 3.141592653589793) && (bVar3 = false, ABS(dVar2) <= 3.141592653589793)) {
        if (((dVar1 != -3.141592653589793) || (NAN(dVar1))) ||
           ((dVar2 == 3.141592653589793 && (!NAN(dVar2))))) {
          if ((dVar2 != -3.141592653589793) || (NAN(dVar2))) {
            bVar3 = true;
          }
          else {
            bVar3 = dVar1 == 3.141592653589793;
          }
        }
        else {
          bVar3 = false;
        }
      }
      dVar9 = dVar1;
      dVar5 = dVar2;
      if (!bVar3) {
        S2LogMessage::S2LogMessage
                  (&local_28,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
                   ,0xe4,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_28.stream_,"Check failed: is_valid() ",0x19);
        goto LAB_0019f313;
      }
      goto LAB_0019f25f;
    }
  }
  if (dVar9 <= dVar2) {
    if (dVar9 <= dVar5) {
      bVar3 = dVar5 <= dVar2;
      goto LAB_0019f006;
    }
  }
  else if ((dVar9 <= dVar5) || (dVar5 <= dVar2)) {
    bVar3 = dVar9 != 3.141592653589793 || dVar2 != -3.141592653589793;
LAB_0019f006:
    if (bVar3) {
      bVar3 = false;
      if ((ABS(dVar5) <= 3.141592653589793) && (bVar3 = false, ABS(dVar9) <= 3.141592653589793)) {
        bVar6 = dVar5 == 3.141592653589793 || dVar9 != -3.141592653589793;
        bVar3 = dVar9 == 3.141592653589793 && bVar6;
        if (dVar5 != -3.141592653589793) {
          bVar3 = bVar6;
        }
        if (NAN(dVar5)) {
          bVar3 = bVar6;
        }
      }
      if (!bVar3) {
        S2LogMessage::S2LogMessage
                  (&local_28,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
                   ,0xe4,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_28.stream_,"Check failed: is_valid() ",0x19);
        goto LAB_0019f313;
      }
      goto LAB_0019f25f;
    }
  }
  if (dVar1 <= dVar5) {
    if (dVar1 <= dVar9) {
      bVar3 = dVar9 <= dVar5;
      goto LAB_0019f121;
    }
  }
  else if ((dVar1 <= dVar9) || (dVar9 <= dVar5)) {
    bVar3 = dVar1 != 3.141592653589793 || dVar5 != -3.141592653589793;
LAB_0019f121:
    dVar5 = dVar2;
    if (bVar3) goto LAB_0019f25f;
  }
  bVar3 = Intersects(this,y);
  if (bVar3) {
    S2LogMessage::S2LogMessage
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
               ,0x117,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_28.stream_,"Check failed: !Intersects(y) ",0x1d);
    dVar9 = 3.141592653589793;
    dVar5 = -3.141592653589793;
    if (bVar3) {
LAB_0019f313:
      abort();
    }
  }
  else {
    dVar9 = 3.141592653589793;
    dVar5 = -3.141592653589793;
  }
LAB_0019f25f:
  SVar10.bounds_.c_[1] = dVar5;
  SVar10.bounds_.c_[0] = dVar9;
  return (S1Interval)SVar10.bounds_.c_;
}

Assistant:

bool S1Interval::Contains(const S1Interval& y) const {
  // It might be helpful to compare the structure of these tests to
  // the simpler Contains(double) method above.

  if (is_inverted()) {
    if (y.is_inverted()) return y.lo() >= lo() && y.hi() <= hi();
    return (y.lo() >= lo() || y.hi() <= hi()) && !is_empty();
  } else {
    if (y.is_inverted()) return is_full() || y.is_empty();
    return y.lo() >= lo() && y.hi() <= hi();
  }
}